

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtexthtmlparser.cpp
# Opt level: O3

QTextHtmlParserNode * __thiscall QTextHtmlParser::newNode(QTextHtmlParser *this,int parent)

{
  char16_t cVar1;
  long lVar2;
  long lVar3;
  QTextHtmlParserNode **ppQVar4;
  QArrayData *pQVar5;
  char cVar6;
  iterator iVar7;
  QTextHtmlParserNode *pQVar8;
  QTextHtmlParserNode *pQVar9;
  wchar32 wVar10;
  int iVar11;
  long in_FS_OFFSET;
  QTextHtmlParserNode *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  iVar7 = QList<QTextHtmlParserNode_*>::end(&this->nodes);
  lVar2 = (this->nodes).d.size;
  if ((lVar2 != 1) && (pQVar8 = iVar7.i[-1], (pQVar8->tag).d.size == 0)) {
    lVar3 = (pQVar8->text).d.size;
    if (lVar3 == 0) {
LAB_0050f5b3:
      if ((pQVar8->tag).d.ptr != (char16_t *)0x0) {
        pQVar5 = &((pQVar8->tag).d.d)->super_QArrayData;
        (pQVar8->tag).d.d = (Data *)0x0;
        (pQVar8->tag).d.ptr = (char16_t *)0x0;
        (pQVar8->tag).d.size = 0;
        if (pQVar5 != (QArrayData *)0x0) {
          LOCK();
          (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar5,2,0x10);
          }
        }
      }
      if ((pQVar8->text).d.ptr != (char16_t *)0x0) {
        pQVar5 = &((pQVar8->text).d.d)->super_QArrayData;
        (pQVar8->text).d.d = (Data *)0x0;
        (pQVar8->text).d.ptr = (char16_t *)0x0;
        (pQVar8->text).d.size = 0;
        if (pQVar5 != (QArrayData *)0x0) {
          LOCK();
          (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar5,2,0x10);
          }
        }
      }
      pQVar8->id = Html_unknown;
      goto LAB_0050f51b;
    }
    if ((lVar3 == 1) &&
       (((cVar1 = *(pQVar8->text).d.ptr, (ushort)cVar1 - 9 < 5 || (cVar1 == L' ')) ||
        ((0x7f < (ushort)cVar1 &&
         (((wVar10 = (wchar32)(ushort)cVar1, wVar10 == L'\x85' || (wVar10 == L'\xa0')) ||
          (cVar6 = QChar::isSpace_helper(wVar10), cVar6 != '\0')))))))) {
      iVar11 = (int)lVar2 + -2;
      ppQVar4 = (this->nodes).d.ptr;
      while (iVar11 != 0) {
        pQVar9 = ppQVar4[iVar11];
        iVar11 = pQVar9->parent;
        if ((iVar11 == pQVar8->parent) || ((*(ushort *)&pQVar9->field_0x90 & 0xe00) != 0x200))
        goto LAB_0050f59c;
      }
      pQVar9 = *ppQVar4;
LAB_0050f59c:
      if ((*(ushort *)&pQVar9->field_0x90 & 0xe00) != 0x200) goto LAB_0050f5b3;
    }
  }
  pQVar8 = (QTextHtmlParserNode *)operator_new(0x1e0);
  QTextHtmlParserNode::QTextHtmlParserNode(pQVar8);
  local_30 = pQVar8;
  QtPrivate::QPodArrayOps<QTextHtmlParserNode*>::emplace<QTextHtmlParserNode*&>
            ((QPodArrayOps<QTextHtmlParserNode*> *)this,(this->nodes).d.size,&local_30);
  QList<QTextHtmlParserNode_*>::end(&this->nodes);
  iVar7 = QList<QTextHtmlParserNode_*>::end(&this->nodes);
  pQVar8 = iVar7.i[-1];
LAB_0050f51b:
  pQVar8->parent = parent;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return pQVar8;
}

Assistant:

QTextHtmlParserNode *QTextHtmlParser::newNode(int parent)
{
    QTextHtmlParserNode *lastNode = nodes.last();
    QTextHtmlParserNode *newNode = nullptr;

    bool reuseLastNode = true;

    if (nodes.size() == 1) {
        reuseLastNode = false;
    } else if (lastNode->tag.isEmpty()) {

        if (lastNode->text.isEmpty()) {
            reuseLastNode = true;
        } else { // last node is a text node (empty tag) with some text

            if (lastNode->text.size() == 1 && lastNode->text.at(0).isSpace()) {

                int lastSibling = count() - 2;
                while (lastSibling
                       && at(lastSibling).parent != lastNode->parent
                       && at(lastSibling).displayMode == QTextHtmlElement::DisplayInline) {
                    lastSibling = at(lastSibling).parent;
                }

                if (at(lastSibling).displayMode == QTextHtmlElement::DisplayInline) {
                    reuseLastNode = false;
                } else {
                    reuseLastNode = true;
                }
            } else {
                // text node with real (non-whitespace) text -> nothing to re-use
                reuseLastNode = false;
            }

        }

    } else {
        // last node had a proper tag -> nothing to re-use
        reuseLastNode = false;
    }

    if (reuseLastNode) {
        newNode = lastNode;
        newNode->tag.clear();
        newNode->text.clear();
        newNode->id = Html_unknown;
    } else {
        nodes.append(new QTextHtmlParserNode);
        newNode = nodes.last();
    }

    newNode->parent = parent;
    return newNode;
}